

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffchtps(void)

{
  return 0;
}

Assistant:

int ffchtps(void)
{
   /* Wrapper function for global cleanup of curl library.
      This is NOT THREAD-SAFE */
#ifdef CFITSIO_HAVE_CURL
   curl_global_cleanup();
#endif
   return 0;
}